

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::PerspectiveCameraNode::print
          (PerspectiveCameraNode *this,ostream *cout,int depth)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  ostream *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cout_00;
  
  poVar2 = std::operator<<(in_RSI,"PerspectiveCameraNode @ ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI);
  poVar2 = std::operator<<(poVar2," { ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator!=(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8));
  if (bVar1) {
    tab((ostream *)in_RDI,in_stack_ffffffffffffffac);
    poVar2 = std::operator<<(in_RSI,"name = ");
    poVar2 = std::operator<<(poVar2,(string *)in_RDI[1].field_2._M_local_buf);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  tab((ostream *)in_RDI,in_stack_ffffffffffffffac);
  poVar2 = std::operator<<(in_RSI,"from = ");
  pbVar3 = in_RDI;
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)&in_RDI[3].field_2);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)((long)&in_RDI[3].field_2 + 4));
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)((long)&in_RDI[3].field_2 + 8));
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  tab((ostream *)pbVar3,in_stack_ffffffffffffffac);
  poVar2 = std::operator<<(in_RSI,"to   = ");
  cout_00 = pbVar3;
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(pbVar3 + 4));
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)&pbVar3[4].field_0x4);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)&pbVar3[4]._M_string_length);
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  tab((ostream *)cout_00,in_stack_ffffffffffffffac);
  poVar2 = std::operator<<(in_RSI,"up   = ");
  pbVar3 = cout_00;
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)&cout_00[4].field_2);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)((long)&cout_00[4].field_2 + 4));
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)((long)&cout_00[4].field_2 + 8));
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  tab((ostream *)pbVar3,in_stack_ffffffffffffffac);
  poVar2 = std::operator<<(in_RSI,"fov  = ");
  this_00 = (void *)std::ostream::operator<<(poVar2,*(float *)(pbVar3 + 5));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  tab((ostream *)pbVar3,in_stack_ffffffffffffffac);
  poVar2 = std::operator<<(in_RSI,"}");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SceneGraph::PerspectiveCameraNode::print(std::ostream& cout, int depth) {
    cout << "PerspectiveCameraNode @ " << this << " { " << std::endl;
    if (name != "") {
      tab(cout, depth+1); cout << "name = " << name << std::endl;
    }
    tab(cout, depth+1); cout << "from = " << data.from << std::endl;
    tab(cout, depth+1); cout << "to   = " << data.to   << std::endl;
    tab(cout, depth+1); cout << "up   = " << data.up   << std::endl;
    tab(cout, depth+1); cout << "fov  = " << data.fov  << std::endl;
    tab(cout, depth); cout << "}" << std::endl;
  }